

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O2

void __thiscall avro::json::JsonParser::expectToken(JsonParser *this,Token tk)

{
  string *__lhs;
  bool bVar1;
  Token TVar2;
  ostream *poVar3;
  Exception *this_00;
  double dVar4;
  string local_1b0;
  ostringstream oss;
  
  TVar2 = advance(this);
  if (TVar2 == tk) {
    return;
  }
  if (tk == tkDouble) {
    TVar2 = this->curToken;
    if (TVar2 == tkString) {
      __lhs = &this->sv;
      bVar1 = std::operator==(__lhs,"Infinity");
      if (((bVar1) || (bVar1 = std::operator==(__lhs,"-Infinity"), bVar1)) ||
         (bVar1 = std::operator==(__lhs,"NaN"), bVar1)) {
        this->curToken = tkDouble;
        bVar1 = std::operator==(__lhs,"Infinity");
        if (bVar1) {
          dVar4 = INFINITY;
        }
        else {
          bVar1 = std::operator==(__lhs,"-Infinity");
          if (bVar1) {
            dVar4 = -INFINITY;
          }
          else {
            dVar4 = NAN;
          }
        }
        goto LAB_0017f66d;
      }
      TVar2 = this->curToken;
    }
    if (TVar2 == tkLong) {
      dVar4 = (double)this->lv;
LAB_0017f66d:
      this->dv = dVar4;
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Incorrect token in the stream. Expected: ");
  poVar3 = std::operator<<(poVar3,*(char **)(tokenNames + (ulong)tk * 8));
  poVar3 = std::operator<<(poVar3,", found ");
  std::operator<<(poVar3,*(char **)(tokenNames + (ulong)this->curToken * 8));
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  Exception::Exception(this_00,&local_1b0);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void JsonParser::expectToken(Token tk)
{
    if (advance() != tk) {
        if (tk == tkDouble) {
            if(cur() == tkString
                && (sv == "Infinity" || sv == "-Infinity" || sv == "NaN")) {
                curToken = tkDouble;
                dv = sv == "Infinity" ?
                    std::numeric_limits<double>::infinity() :
                    sv == "-Infinity" ?
                        -std::numeric_limits<double>::infinity() :
                    std::numeric_limits<double>::quiet_NaN();
                return;
            } else if (cur() == tkLong) {
                dv = double(lv);
                return;
            }
        }
        ostringstream oss;
        oss << "Incorrect token in the stream. Expected: "
            << JsonParser::toString(tk) << ", found "
            << JsonParser::toString(cur());
        throw Exception(oss.str());
    }
}